

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_COMMAND(effect_handler_context_t_conflict *context)

{
  wchar_t v;
  uint32_t uVar1;
  uint32_t uVar2;
  monster_conflict *mon;
  char m_name [80];
  
  v = effect_calculate_value(context,false);
  mon = (monster_conflict *)target_get_monster();
  context->ident = true;
  if (mon == (monster_conflict *)0x0) {
    msg("No monster selected!");
  }
  else {
    monster_wake(mon,false,L'd');
    uVar1 = Rand_div((int)player->lev);
    uVar2 = Rand_div(mon->race->level);
    if ((int)uVar1 < (int)uVar2) {
      monster_desc(m_name,0x50,(monster *)mon,L'̔');
      msg("%s resists your command!",m_name);
    }
    else {
      if (v < L'\x01') {
        v = L'\0';
      }
      player_set_timed(player,L',',v,false,false);
      mon_inc_timed((monster *)mon,L'\b',v,L'\0');
    }
  }
  return mon != (monster_conflict *)0x0;
}

Assistant:

bool effect_handler_COMMAND(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	struct monster *mon = target_get_monster();

	context->ident = true;

	/* Need to choose a monster, not just point */
	if (!mon) {
		msg("No monster selected!");
		return false;
	}

	/* Wake up, become aware */
	monster_wake(mon, false, 100);

	/* Explicit saving throw */
	if (randint1(player->lev) < randint1(mon->race->level)) {
		char m_name[80];
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
		msg("%s resists your command!", m_name);
		/* Take a turn and deduct mana when the monster resists. */
		return true;
	}

	/* Player is commanding */
	player_set_timed(player, TMD_COMMAND, MAX(amount, 0), false, false);

	/* Monster is commanded */
	mon_inc_timed(mon, MON_TMD_COMMAND, MAX(amount, 0), 0);

	return true;
}